

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O2

bool __thiscall
mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::is_normalized
          (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *this)

{
  double *pdVar1;
  
  QuadAndLinTerms::sort_terms(&this->super_QuadAndLinTerms);
  if ((this->super_QuadAndLinTerms).super_LinTerms.coefs_.
      super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size == 0) {
    pdVar1 = &((this->super_QuadAndLinTerms).super_QuadTerms.folded_.
               super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
               m_data.
               super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
              .m_data_ptr)->second;
  }
  else {
    pdVar1 = (this->super_QuadAndLinTerms).super_LinTerms.coefs_.
             super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
  }
  return 0.0 < *pdVar1;
}

Assistant:

bool is_normalized() {
    sort_terms();
    return GetBody().is_normalized();
  }